

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrsmem.c
# Opt level: O0

int shared_destroy_entry(int idx)

{
  int local_24;
  uint uStack_1c;
  semun filler;
  int r2;
  int r;
  int idx_local;
  
  if ((idx < 0) || (shared_maxseg <= idx)) {
    r = 0x97;
  }
  else {
    filler._4_4_ = 0;
    filler.val = 0;
    if (shared_gt[idx].sem != -1) {
      filler._4_4_ = semctl(shared_gt[idx].sem,0,0,(ulong)uStack_1c << 0x20);
    }
    if (shared_gt[idx].handle != -1) {
      filler.val = shmctl(shared_gt[idx].handle,0,(shmid_ds *)0x0);
    }
    if (filler._4_4_ == 0) {
      filler._4_4_ = filler.val;
    }
    local_24 = shared_clear_entry(idx);
    if (filler._4_4_ != 0) {
      local_24 = filler._4_4_;
    }
    r = local_24;
  }
  return r;
}

Assistant:

static  int shared_destroy_entry(int idx)       /* unconditionally destroy sema & shseg and clear entry */
 { int r, r2;
   union semun filler;

   if ((idx < 0) || (idx >= shared_maxseg)) return(SHARED_BADARG);
   r2 = r = SHARED_OK;
   filler.val = 0;                              /* this is to make cc happy (warning otherwise) */
   if (SHARED_INVALID != shared_gt[idx].sem)  r = semctl(shared_gt[idx].sem, 0, IPC_RMID, filler); /* destroy semaphore */
   if (SHARED_INVALID != shared_gt[idx].handle) r2 = shmctl(shared_gt[idx].handle, IPC_RMID, 0); /* destroy shared memory segment */
   if (SHARED_OK == r) r = r2;                  /* accumulate error code in r, free r2 */
   r2 = shared_clear_entry(idx);
   return((SHARED_OK == r) ? r2 : r);
 }